

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void sha256_vector(size_t num_elem,uint8_t **addr,size_t *len,uint8_t *mac)

{
  ulong local_98;
  size_t i;
  sha256_context ctx;
  uint8_t *mac_local;
  size_t *len_local;
  uint8_t **addr_local;
  size_t num_elem_local;
  
  ctx.buffer._56_8_ = mac;
  sha256_init((sha256_context *)&i);
  sha256_starts((sha256_context *)&i);
  for (local_98 = 0; local_98 < num_elem; local_98 = local_98 + 1) {
    sha256_update((sha256_context *)&i,addr[local_98],len[local_98]);
  }
  sha256_final((sha256_context *)&i,(uchar *)ctx.buffer._56_8_);
  return;
}

Assistant:

void sha256_vector(size_t num_elem, const uint8_t *addr[], const size_t *len,
     uint8_t *mac)
{
  sha256_context ctx;
  size_t i;

  sha256_init(&ctx);
  sha256_starts(&ctx);
  for (i = 0; i < num_elem; i++)
    sha256_update(&ctx, addr[i], len[i]);
  sha256_final(&ctx, mac);
}